

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O1

int mbedtls_net_bind(mbedtls_net_context *ctx,char *bind_ip,char *port,int proto)

{
  int iVar1;
  int iVar2;
  int iVar3;
  addrinfo *paVar4;
  int n;
  addrinfo *addr_list;
  undefined4 local_74;
  addrinfo *local_70;
  addrinfo local_68;
  
  signal(0xd,(__sighandler_t)0x1);
  local_68.ai_protocol = 6;
  if (proto == 1) {
    local_68.ai_protocol = 0x11;
  }
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = (proto == 1) + 1;
  local_68._1_7_ = 0;
  local_68.ai_flags._0_1_ = bind_ip == (char *)0x0;
  iVar1 = getaddrinfo(bind_ip,port,&local_68,&local_70);
  iVar2 = -0x52;
  if (iVar1 == 0) {
    if (local_70 != (addrinfo *)0x0) {
      paVar4 = local_70;
      do {
        iVar2 = socket(paVar4->ai_family,paVar4->ai_socktype,paVar4->ai_protocol);
        ctx->fd = iVar2;
        if (iVar2 < 0) {
          iVar2 = -0x42;
        }
        else {
          local_74 = 1;
          iVar3 = setsockopt(iVar2,1,2,&local_74,4);
          iVar1 = ctx->fd;
          iVar2 = -0x42;
          if (iVar3 == 0) {
            iVar2 = bind(iVar1,paVar4->ai_addr,paVar4->ai_addrlen);
            iVar1 = -0x46;
            if (iVar2 == 0) {
              iVar2 = 0;
              if (proto != 0) break;
              iVar3 = listen(ctx->fd,10);
              iVar2 = 0;
              iVar1 = -0x48;
              if (iVar3 == 0) break;
            }
            iVar2 = iVar1;
            iVar1 = ctx->fd;
          }
          close(iVar1);
        }
        paVar4 = paVar4->ai_next;
      } while (paVar4 != (addrinfo *)0x0);
    }
    freeaddrinfo(local_70);
  }
  return iVar2;
}

Assistant:

int mbedtls_net_bind( mbedtls_net_context *ctx, const char *bind_ip, const char *port, int proto )
{
    int n, ret;
    struct addrinfo hints, *addr_list, *cur;

    if( ( ret = net_prepare() ) != 0 )
        return( ret );

    /* Bind to IPv6 and/or IPv4, but only in the desired protocol */
    memset( &hints, 0, sizeof( hints ) );
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = proto == MBEDTLS_NET_PROTO_UDP ? SOCK_DGRAM : SOCK_STREAM;
    hints.ai_protocol = proto == MBEDTLS_NET_PROTO_UDP ? IPPROTO_UDP : IPPROTO_TCP;
    if( bind_ip == NULL )
        hints.ai_flags = AI_PASSIVE;

    if( getaddrinfo( bind_ip, port, &hints, &addr_list ) != 0 )
        return( MBEDTLS_ERR_NET_UNKNOWN_HOST );

    /* Try the sockaddrs until a binding succeeds */
    ret = MBEDTLS_ERR_NET_UNKNOWN_HOST;
    for( cur = addr_list; cur != NULL; cur = cur->ai_next )
    {
        ctx->fd = (int) socket( cur->ai_family, cur->ai_socktype,
                            cur->ai_protocol );
        if( ctx->fd < 0 )
        {
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        n = 1;
        if( setsockopt( ctx->fd, SOL_SOCKET, SO_REUSEADDR,
                        (const char *) &n, sizeof( n ) ) != 0 )
        {
            close( ctx->fd );
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        if( bind( ctx->fd, cur->ai_addr, MSVC_INT_CAST cur->ai_addrlen ) != 0 )
        {
            close( ctx->fd );
            ret = MBEDTLS_ERR_NET_BIND_FAILED;
            continue;
        }

        /* Listen only makes sense for TCP */
        if( proto == MBEDTLS_NET_PROTO_TCP )
        {
            if( listen( ctx->fd, MBEDTLS_NET_LISTEN_BACKLOG ) != 0 )
            {
                close( ctx->fd );
                ret = MBEDTLS_ERR_NET_LISTEN_FAILED;
                continue;
            }
        }

        /* Bind was successful */
        ret = 0;
        break;
    }

    freeaddrinfo( addr_list );

    return( ret );

}